

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_pcmpgth_mips64el(uint64_t fs,uint64_t ft)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = fs;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = ft;
  auVar2 = auVar2 ^ _DAT_00d83570;
  auVar1 = auVar1 ^ _DAT_00d83570;
  return CONCAT26(-(ushort)(auVar2._6_2_ < auVar1._6_2_),
                  CONCAT24(-(ushort)(auVar2._4_2_ < auVar1._4_2_),
                           CONCAT22(-(ushort)(auVar2._2_2_ < auVar1._2_2_),
                                    -(ushort)(auVar2._0_2_ < auVar1._0_2_))));
}

Assistant:

uint64_t helper_pcmpgth(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; i++) {
        vs.uh[i] = -(vs.uh[i] > vt.uh[i]);
    }
    return vs.d;
}